

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

void indk::System::setComputeBackend(int Backend,int Parameter)

{
  ComputeBackendDefault *this;
  ComputeBackendMultithread *this_00;
  ostream *this_01;
  int local_44;
  int local_10;
  int Parameter_local;
  int Backend_local;
  
  if ((CurrentComputeBackend != -1) && (ComputeBackend != (Computer *)0x0)) {
    operator_delete(ComputeBackend,8);
  }
  CurrentComputeBackend = Backend;
  if (Backend == 0) {
    SynchronizationNeeded = false;
    this = (ComputeBackendDefault *)operator_new(0x20);
    ComputeBackendDefault::ComputeBackendDefault(this);
    local_10 = 1;
    ComputeBackend = (Computer *)this;
  }
  else {
    local_10 = Parameter;
    if (Backend == 1) {
      SynchronizationNeeded = true;
      this_00 = (ComputeBackendMultithread *)operator_new(0x58);
      local_44 = Parameter;
      if (Parameter < 2) {
        local_44 = 2;
      }
      ComputeBackendMultithread::ComputeBackendMultithread(this_00,local_44);
      ComputeBackend = (Computer *)this_00;
    }
    else if (Backend == 2) {
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      this_01 = std::operator<<((ostream *)&std::cerr,
                                "The OpenCL compute backend is not supported by the current build. Rebuild interfernce library with the INDK_OPENCL_SUPPORT=ON flag."
                               );
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      CurrentComputeBackend = -1;
      return;
    }
  }
  ComputeBackendParameter = local_10;
  return;
}

Assistant:

void indk::System::setComputeBackend(int Backend, int Parameter) {
    if (CurrentComputeBackend != -1) delete ComputeBackend;
    CurrentComputeBackend = Backend;

    switch (CurrentComputeBackend) {
        case indk::System::ComputeBackends::Default:
            SynchronizationNeeded = false;
            ComputeBackend = new indk::ComputeBackendDefault();
            Parameter = 1;
            break;
        case indk::System::ComputeBackends::Multithread:
            SynchronizationNeeded = true;
            ComputeBackend = new indk::ComputeBackendMultithread(Parameter>1?Parameter:indk_MULTITHREAD_DEFAULT_NUM);
            break;
        case indk::System::ComputeBackends::OpenCL:
#ifdef INDK_OPENCL_SUPPORT
            SynchronizationNeeded = true;
            ComputeBackend = new indk::ComputeBackendOpenCL();
            Parameter = 1;
            break;
#else
            std::cerr << std::endl;
            std::cerr << "The OpenCL compute backend is not supported by the current build. Rebuild interfernce library with the INDK_OPENCL_SUPPORT=ON flag." << std::endl;
            CurrentComputeBackend = -1;
            return;
#endif
    }
    ComputeBackendParameter = Parameter;
}